

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void update_output(EPSG *psg)

{
  uint uVar1;
  byte bVar2;
  uint8_t uVar3;
  uint32_t local_20;
  uint32_t incr;
  int noise;
  int i;
  EPSG *psg_local;
  
  psg->base_count = psg->base_incr + psg->base_count;
  uVar1 = psg->base_count;
  psg->base_count = psg->base_count & 0xffffff;
  psg->env_count = (uVar1 >> 0x18) + psg->env_count;
  while (0xffff < psg->env_count) {
    if (psg->env_pause == '\0') {
      if (psg->env_face == '\0') {
        psg->env_ptr = psg->env_ptr + 0x3f & 0x3f;
      }
      else {
        psg->env_ptr = psg->env_ptr + 1 & 0x3f;
      }
    }
    if ((psg->env_ptr & 0x20) != 0) {
      if (psg->env_continue == '\0') {
        psg->env_pause = '\x01';
        psg->env_ptr = '\0';
      }
      else {
        if (psg->env_alternate != psg->env_hold) {
          psg->env_face = psg->env_face ^ 1;
        }
        if (psg->env_hold != '\0') {
          psg->env_pause = '\x01';
        }
        uVar3 = '\x1f';
        if (psg->env_face != '\0') {
          uVar3 = '\0';
        }
        psg->env_ptr = uVar3;
      }
    }
    if (psg->env_freq == 0) {
      local_20 = 1;
    }
    else {
      local_20 = psg->env_freq;
    }
    psg->env_count = psg->env_count - local_20;
  }
  bVar2 = (byte)(uVar1 >> 0x18);
  psg->noise_count = psg->noise_count + bVar2;
  if ((psg->noise_count & 0x40) != 0) {
    if ((psg->noise_seed & 1) != 0) {
      psg->noise_seed = psg->noise_seed ^ 0x24000;
    }
    psg->noise_seed = psg->noise_seed >> 1;
    if (psg->noise_freq == '\0') {
      uVar3 = '\x02';
    }
    else {
      uVar3 = psg->noise_freq;
    }
    psg->noise_count = psg->noise_count - uVar3;
  }
  uVar1 = psg->noise_seed;
  for (incr = 0; (int)incr < 3; incr = incr + 1) {
    psg->count[(int)incr] = psg->count[(int)incr] + (ushort)bVar2;
    if ((psg->count[(int)incr] & 0x1000) != 0) {
      if (psg->freq[(int)incr] < 2) {
        psg->edge[(int)incr] = '\x01';
      }
      else {
        psg->edge[(int)incr] = (psg->edge[(int)incr] != '\0' ^ 0xffU) & 1;
        psg->count[(int)incr] = psg->count[(int)incr] - psg->freq[(int)incr];
      }
    }
    psg->ch_out[(int)incr] = 0;
    if ((((psg->mask & 1 << ((byte)incr & 0x1f)) == 0) &&
        ((psg->tmask[(int)incr] != '\0' || (psg->edge[(int)incr] != '\0')))) &&
       ((psg->nmask[(int)incr] != '\0' || ((uVar1 & 1) != 0)))) {
      if ((psg->volume[(int)incr] & 0x20) == 0) {
        psg->ch_out[(int)incr] = (int16_t)(psg->voltbl[(int)(psg->volume[(int)incr] & 0x1f)] << 5);
      }
      else {
        psg->ch_out[(int)incr] = (int16_t)(psg->voltbl[psg->env_ptr] << 5);
      }
    }
  }
  return;
}

Assistant:

INLINE void
update_output (EPSG * psg)
{

  int i, noise;
  uint32_t incr;

  psg->base_count += psg->base_incr;
  incr = (psg->base_count >> GETA_BITS);
  psg->base_count &= (1 << GETA_BITS) - 1;

  /* Envelope */
  psg->env_count += incr;
  while (psg->env_count>=0x10000)
  {
    if (!psg->env_pause)
    {
      if(psg->env_face)
        psg->env_ptr = (psg->env_ptr + 1) & 0x3f ; 
      else
        psg->env_ptr = (psg->env_ptr + 0x3f) & 0x3f;
    }

    if (psg->env_ptr & 0x20) /* if carry or borrow */
    {
      if (psg->env_continue)
      {
        if (psg->env_alternate^psg->env_hold) psg->env_face ^= 1;
        if (psg->env_hold) psg->env_pause = 1;
        psg->env_ptr = psg->env_face?0:0x1f;       
      }
      else
      {
        psg->env_pause = 1;
        psg->env_ptr = 0;
      }
    }

    psg->env_count -= psg->env_freq?psg->env_freq:1; /* env_freq 0 is the same as 1. */
  }

  /* Noise */
  psg->noise_count += incr;
  if (psg->noise_count & 0x40)
  {
    if (psg->noise_seed & 1)
      psg->noise_seed ^= 0x24000;
    psg->noise_seed >>= 1;
    psg->noise_count -= psg->noise_freq?psg->noise_freq:(1<<1);
  }
  noise = psg->noise_seed & 1;

  /* Tone */
  for (i = 0; i < 3; i++)
  {
    psg->count[i] += incr;
    if (psg->count[i] & 0x1000)
    {
      if (psg->freq[i] > 1)
      {
        psg->edge[i] = !psg->edge[i];
        psg->count[i] -= psg->freq[i];
      }
      else
      {
        psg->edge[i] = 1;
      }
    }

    psg->ch_out[i] = 0;

    if (psg->mask&EPSG_MASK_CH(i))
      continue;

    if ((psg->tmask[i]||psg->edge[i]) && (psg->nmask[i]||noise))
    {
      if (!(psg->volume[i] & 32))
        psg->ch_out[i] = (psg->voltbl[psg->volume[i] & 31] << 5);
      else
        psg->ch_out[i] = (psg->voltbl[psg->env_ptr] << 5);
    }

    //psg->ch_out[i] >>= 1;

  }

}